

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyPressed(ImGuiKey key,bool repeat)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  ImGuiKeyData *pIVar4;
  undefined1 in_SIL;
  float t;
  ImGuiKeyData *key_data;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffe0;
  ImGuiContext *pIVar5;
  float in_stack_fffffffffffffff0;
  undefined3 in_stack_fffffffffffffff4;
  uint key_00;
  bool local_1;
  
  key_00 = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  pIVar5 = GImGui;
  pIVar4 = GetKeyData((ImGuiKey)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  fVar2 = pIVar4->DownDuration;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    if (((key_00 & 0x1000000) == 0) ||
       (pfVar1 = &(pIVar5->IO).KeyRepeatDelay, fVar2 < *pfVar1 || fVar2 == *pfVar1)) {
      local_1 = false;
    }
    else {
      iVar3 = GetKeyPressedAmount(key_00,in_stack_fffffffffffffff0,(float)((ulong)pIVar5 >> 0x20));
      local_1 = 0 < iVar3;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, bool repeat)
{
    ImGuiContext& g = *GImGui;
    const ImGuiKeyData* key_data = GetKeyData(key);
    const float t = key_data->DownDuration;
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(key, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}